

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O1

uint32_t __thiscall AbstractModuleClient::latestTrodesTimestamp(AbstractModuleClient *this)

{
  mutex *__mutex;
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t extraout_EAX;
  void *pvVar4;
  uint32_t *puVar5;
  long lVar6;
  MlmWrap *this_00;
  zmq_msg_t msg;
  long *aplStack_d8 [2];
  long alStack_c8 [2];
  string sStack_b8;
  TrodesMsg TStack_98;
  AbstractModuleClient *pAStack_70;
  mutex *pmStack_68;
  undefined1 auStack_58 [64];
  
  if (this->timestampsub == (zsock_t *)0x0) {
    uVar3 = 0;
  }
  else {
    zmq_msg_init(auStack_58);
    __mutex = &this->tsmutex;
    uVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (uVar1 != 0) {
      this_00 = (MlmWrap *)(ulong)uVar1;
      std::__throw_system_error(uVar1);
      sStack_b8._M_dataplus._M_p = (pointer)&sStack_b8.field_2;
      pAStack_70 = this;
      pmStack_68 = __mutex;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_b8,"s","");
      TrodesMsg::TrodesMsg<char_const*>(&TStack_98,&sStack_b8,"infoTR");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_b8._M_dataplus._M_p != &sStack_b8.field_2) {
        operator_delete(sStack_b8._M_dataplus._M_p,sStack_b8.field_2._M_allocated_capacity + 1);
      }
      aplStack_d8[0] = alStack_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)aplStack_d8,"info_req","");
      MlmWrap::sendMessage(this_00,"Trodes",(char *)aplStack_d8[0],&TStack_98,"",0);
      if (aplStack_d8[0] != alStack_c8) {
        operator_delete(aplStack_d8[0],alStack_c8[0] + 1);
      }
      TrodesMsg::~TrodesMsg(&TStack_98);
      return extraout_EAX;
    }
    pvVar4 = zsock_resolve(this->timestampsub);
    iVar2 = zmq_msg_recv(auStack_58,pvVar4,1);
    if (iVar2 == 0xc) {
      puVar5 = (uint32_t *)zmq_msg_data(auStack_58);
      this->lastTimestamp = *puVar5;
      lVar6 = zmq_msg_data(auStack_58);
      this->lastsysTimestamp = *(int64_t *)(lVar6 + 4);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    zmq_msg_close(auStack_58);
    uVar3 = this->lastTimestamp;
  }
  return uVar3;
}

Assistant:

uint32_t AbstractModuleClient::latestTrodesTimestamp(){
    if(!timestampsub){
        return 0;
    }
    //If zmq_recv succeeds, lastTimestamp is replaced. if not, the previous value is returned. win-win with no checks needed
    zmq_msg_t msg;
    zmq_msg_init(&msg);
    tsmutex.lock();
    if(zmq_msg_recv(&msg, zsock_resolve(timestampsub), ZMQ_DONTWAIT) == 12){
        lastTimestamp = *(uint32_t*)zmq_msg_data(&msg);
        lastsysTimestamp = *(int64_t*)((byte*)zmq_msg_data(&msg)+4);
    }
    tsmutex.unlock();
    zmq_msg_close(&msg);
    return lastTimestamp;
}